

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O0

void Macro_smpsFade(uint arg_count,long *arg_array)

{
  long *arg_array_local;
  uint arg_count_local;
  
  if (target_driver < 3) {
    if (((source_driver < 3) || (arg_count == 0)) || (*arg_array == 0xff)) {
      WriteByte(0xe4);
    }
  }
  else {
    WriteByte(0xe2);
    if (arg_count != 0) {
      WriteByte((uchar)*arg_array);
    }
    if (source_driver < 3) {
      Macro_smpsStop(arg_count,arg_array);
    }
  }
  return;
}

Assistant:

static void Macro_smpsFade(unsigned int arg_count, long arg_array[])
{
	if (target_driver >= 3)
	{
		WriteByte(0xE2);

		if (arg_count >= 1)
			WriteByte(arg_array[0]);

		if (source_driver < 3)
			Macro_smpsStop(arg_count, arg_array);
	}
	else if (source_driver >= 3 && arg_count >= 1 && arg_array[0] != 0xFF)
	{
		// We should ignore these (they're actually smpsNop commands)
	}
	else
	{
		WriteByte(0xE4);
	}
}